

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_UInt16 UA_Server_run_iterate(UA_Server *server,UA_Boolean waitInternal)

{
  UA_ByteString *message;
  RepeatedJob *pRVar1;
  RepeatedJob *pRVar2;
  RepeatedJob **ppRVar3;
  UA_ServerNetworkLayer *pUVar4;
  size_t sVar5;
  UA_UInt16 UVar6;
  UA_StatusCode UVar7;
  UA_DateTime UVar8;
  RepeatedJob *pRVar9;
  long lVar10;
  size_t sVar11;
  RepeatedJob **ppRVar12;
  undefined7 in_register_00000031;
  RepeatedJob *pRVar13;
  RepeatedJob *pRVar14;
  bool bVar15;
  RepeatedJob *local_b0;
  UA_Job *jobs;
  long local_a0;
  RepeatedJob *local_60;
  RepeatedJob **local_58;
  size_t local_50;
  RepeatedJobsList *local_48;
  long local_40;
  UA_Boolean local_31;
  
  local_50 = CONCAT44(local_50._4_4_,(int)CONCAT71(in_register_00000031,waitInternal));
  UVar8 = UA_DateTime_nowMonotonic();
  local_48 = &server->repeatedJobs;
  pRVar9 = (RepeatedJob *)local_48;
  pRVar1 = (RepeatedJob *)0x0;
  do {
    local_60 = pRVar1;
    pRVar9 = (pRVar9->next).le_next;
    if (pRVar9 == (RepeatedJob *)0x0) break;
    pRVar1 = pRVar9;
  } while (pRVar9->nextTime <= UVar8);
  local_a0 = UVar8 + -1;
  local_40 = UVar8 + 1;
  pRVar9 = local_48->lh_first;
  pRVar1 = (RepeatedJob *)&stack0xffffffffffffff50;
  do {
    do {
      pRVar14 = pRVar1;
      pRVar13 = pRVar9;
      if ((pRVar13 == (RepeatedJob *)0x0) || (UVar8 < pRVar13->nextTime)) {
        local_40 = UVar8 + 500000;
        if ((local_48->lh_first != (RepeatedJob *)0x0) &&
           (lVar10 = local_48->lh_first->nextTime, lVar10 < local_40)) {
          local_40 = lVar10;
        }
        local_48 = (RepeatedJobsList *)0x0;
        if ((char)local_50 != '\0') {
          local_48 = (RepeatedJobsList *)((local_40 - UVar8) / 10000);
        }
        ppRVar12 = (RepeatedJob **)0x0;
        do {
          ppRVar3 = (RepeatedJob **)(server->config).networkLayersSize;
          if (ppRVar3 <= ppRVar12) {
            processDelayedCallbacks(server);
            UVar8 = UA_DateTime_nowMonotonic();
            if (local_40 - UVar8 == 0 || local_40 < UVar8) {
              UVar6 = 0;
            }
            else {
              UVar6 = (UA_UInt16)((local_40 - UVar8) / 10000);
            }
            return UVar6;
          }
          pUVar4 = (server->config).networkLayers;
          local_b0 = (RepeatedJob *)0x0;
          UVar6 = 0;
          if (ppRVar12 == (RepeatedJob **)((long)ppRVar3 + -1)) {
            UVar6 = (UA_UInt16)local_48;
          }
          local_58 = ppRVar12;
          sVar11 = (*pUVar4[(long)ppRVar12].getJobs)
                             (pUVar4 + (long)ppRVar12,(UA_Job **)&stack0xffffffffffffff50,UVar6);
          lVar10 = 0x10;
          local_50 = sVar11;
          while (sVar5 = local_50, pRVar9 = local_b0, bVar15 = sVar11 != 0, sVar11 = sVar11 - 1,
                bVar15) {
            if (*(int *)((long)(&local_b0->id + -3) + lVar10) == 2) {
              local_31 = false;
              message = (UA_ByteString *)
                        ((long)&((RepeatedJob *)
                                (&((RepeatedJob *)(&((RepeatedJob *)(&local_b0->id + -2))->id + -2))
                                  ->id + -2))->id + lVar10 + 0xffffffffffffffe0U);
              UVar7 = UA_Connection_completeMessages
                                (*(UA_Connection **)((local_b0->id).data4 + lVar10 + -0x30),message,
                                 &local_31);
              if (UVar7 == 0) {
                if (local_31 == true) {
                  *(undefined4 *)((long)(&pRVar9->id + -3) + lVar10) = 3;
                }
                if (message->length != 0) goto LAB_001197bd;
              }
              else if (UVar7 == 0x80030000) {
                UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_NETWORK,
                               "Lost message(s) from Connection %i as memory could not be allocated"
                               ,(ulong)*(uint *)(*(long *)((pRVar9->id).data4 + lVar10 + -0x30) +
                                                0x38));
              }
              else {
                UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_NETWORK,
                            "Could not merge half-received messages on Connection %i with error 0x%08x"
                            ,(ulong)*(uint *)(*(long *)((pRVar9->id).data4 + lVar10 + -0x30) + 0x38)
                            ,(ulong)UVar7);
              }
              *(undefined4 *)((long)(&pRVar9->id + -3) + lVar10) = 0;
            }
LAB_001197bd:
            lVar10 = lVar10 + 0x20;
          }
          lVar10 = 0;
          sVar11 = local_50;
          while (bVar15 = sVar11 != 0, sVar11 = sVar11 - 1, bVar15) {
            processJob(server,(UA_Job *)
                              ((long)&((RepeatedJob *)
                                      (&((RepeatedJob *)
                                        (&((RepeatedJob *)(&local_b0->id + -2))->id + -2))->id + -2)
                                      )->id + lVar10 + 0xffffffffffffffe0U));
            lVar10 = lVar10 + 0x20;
          }
          if (sVar5 != 0) {
            free(local_b0);
          }
          ppRVar12 = (RepeatedJob **)((long)local_58 + 1);
        } while( true );
      }
      pRVar9 = (pRVar13->next).le_next;
      local_58 = (pRVar13->next).le_prev;
      processJob(server,&pRVar13->job);
      pRVar1 = pRVar14;
    } while (*local_58 != pRVar13);
    lVar10 = pRVar13->nextTime + pRVar13->interval;
    if (lVar10 < UVar8) {
      lVar10 = local_40;
    }
    pRVar13->nextTime = lVar10;
    if (pRVar14->nextTime == lVar10) {
      if (pRVar14 == (RepeatedJob *)&stack0xffffffffffffff50) {
        __assert_fail("last_dispatched != &tmp_last",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                      ,0x46c4,
                      "UA_DateTime processRepeatedJobs(UA_Server *, UA_DateTime, UA_Boolean *)");
      }
    }
    else {
      pRVar1 = local_60;
      if (local_60 == (RepeatedJob *)0x0) {
        __assert_fail("lastNow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                      ,0x46c9,
                      "UA_DateTime processRepeatedJobs(UA_Server *, UA_DateTime, UA_Boolean *)");
      }
      do {
        pRVar14 = pRVar1;
        pRVar1 = (pRVar14->next).le_next;
        if (pRVar1 == (RepeatedJob *)0x0) break;
      } while (pRVar1->nextTime < lVar10);
    }
    pRVar1 = pRVar13;
    if (pRVar14 != pRVar13) {
      pRVar2 = (pRVar13->next).le_next;
      ppRVar12 = (pRVar13->next).le_prev;
      if (pRVar2 != (RepeatedJob *)0x0) {
        (pRVar2->next).le_prev = ppRVar12;
      }
      *ppRVar12 = pRVar2;
      pRVar2 = (pRVar14->next).le_next;
      (pRVar13->next).le_next = pRVar2;
      if (pRVar2 != (RepeatedJob *)0x0) {
        (pRVar2->next).le_prev = (RepeatedJob **)pRVar13;
      }
      (pRVar14->next).le_next = pRVar13;
      (pRVar13->next).le_prev = (RepeatedJob **)pRVar14;
    }
  } while( true );
}

Assistant:

UA_UInt16 UA_Server_run_iterate(UA_Server *server, UA_Boolean waitInternal) {
#ifdef UA_ENABLE_MULTITHREADING
    /* Run work assigned for the main thread */
    processMainLoopJobs(server);
#endif
    /* Process repeated work */
    UA_DateTime now = UA_DateTime_nowMonotonic();
    UA_Boolean dispatched = false; /* to wake up worker threads */
    UA_DateTime nextRepeated = processRepeatedJobs(server, now, &dispatched);

    UA_UInt16 timeout = 0;
    if(waitInternal)
        timeout = (UA_UInt16)((nextRepeated - now) / UA_MSEC_TO_DATETIME);

    /* Get work from the networklayer */
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        UA_Job *jobs = NULL;
        size_t jobsSize;
        /* only the last networklayer waits on the tieout */
        if(i == server->config.networkLayersSize-1)
            jobsSize = nl->getJobs(nl, &jobs, timeout);
        else
            jobsSize = nl->getJobs(nl, &jobs, 0);

        for(size_t k = 0; k < jobsSize; ++k) {
#ifdef UA_ENABLE_MULTITHREADING
            /* Filter out delayed work */
            if(jobs[k].type == UA_JOBTYPE_METHODCALL_DELAYED) {
                addDelayedJob(server, &jobs[k]);
                jobs[k].type = UA_JOBTYPE_NOTHING;
                continue;
            }
#endif
            /* Merge half-received messages */
            if(jobs[k].type == UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER)
                completeMessages(server, &jobs[k]);
        }

        /* Dispatch/process jobs */
        for(size_t j = 0; j < jobsSize; ++j) {
#ifdef UA_ENABLE_MULTITHREADING
            dispatchJob(server, &jobs[j]);
            dispatched = true;
#else
            processJob(server, &jobs[j]);
#endif
        }

        /* Clean up jobs list */
        if(jobsSize > 0)
            UA_free(jobs);
    }

#ifdef UA_ENABLE_MULTITHREADING
    /* Wake up worker threads */
    if(dispatched)
        pthread_cond_broadcast(&server->dispatchQueue_condition);
#else
    processDelayedCallbacks(server);
#endif

    now = UA_DateTime_nowMonotonic();
    timeout = 0;
    if(nextRepeated > now)
        timeout = (UA_UInt16)((nextRepeated - now) / UA_MSEC_TO_DATETIME);
    return timeout;
}